

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::Datum::InternalSwap(Datum *this,Datum *other)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  void *pvVar6;
  UnknownFieldSet *other_00;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->float_data_,&other->float_data_);
  psVar5 = (this->data_).ptr_;
  (this->data_).ptr_ = (other->data_).ptr_;
  (other->data_).ptr_ = psVar5;
  iVar2 = this->channels_;
  this->channels_ = other->channels_;
  other->channels_ = iVar2;
  iVar2 = this->height_;
  this->height_ = other->height_;
  other->height_ = iVar2;
  iVar2 = this->width_;
  this->width_ = other->width_;
  other->width_ = iVar2;
  iVar2 = this->label_;
  this->label_ = other->label_;
  other->label_ = iVar2;
  bVar1 = this->encoded_;
  this->encoded_ = other->encoded_;
  other->encoded_ = bVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar6 & 1) == 0) goto LAB_004881a3;
LAB_00488196:
    other_00 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_00488196;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004881a3:
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void Datum::InternalSwap(Datum* other) {
  float_data_.InternalSwap(&other->float_data_);
  data_.Swap(&other->data_);
  std::swap(channels_, other->channels_);
  std::swap(height_, other->height_);
  std::swap(width_, other->width_);
  std::swap(label_, other->label_);
  std::swap(encoded_, other->encoded_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}